

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Yolov3DetectionOutput_x86::forward
          (Yolov3DetectionOutput_x86 *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
  *this_00;
  undefined4 uVar2;
  size_t sVar3;
  void *pvVar4;
  iterator __position;
  Mat *this_01;
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined8 uVar7;
  undefined8 uVar8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar9;
  int iVar10;
  int iVar11;
  float *pfVar12;
  undefined4 *puVar13;
  _func_int **pp_Var14;
  int iVar15;
  BBoxRect *__args;
  long lVar16;
  float *pfVar17;
  _func_int *p_Var18;
  _func_int *p_Var19;
  long lVar20;
  pointer pMVar21;
  float *pfVar22;
  ulong uVar23;
  ulong uVar24;
  uint _h;
  float fVar25;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined1 auVar26 [16];
  float fVar27;
  float fVar28;
  float fVar30;
  undefined1 auVar29 [16];
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  float fVar37;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  bbox_rects;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  all_bbox_rects;
  vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  local_1a8;
  ulong local_188;
  long local_180;
  BBoxRect local_178;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  local_158;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  ulong local_128;
  float *local_120;
  float *local_118;
  float *local_110;
  float local_108;
  float fStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  float local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_e8;
  Option *local_e0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_d8;
  pointer local_d0;
  long local_c8;
  long local_c0;
  void *local_b8;
  ulong local_b0;
  void *local_a8;
  ulong local_a0;
  long local_98;
  float *local_90;
  undefined1 local_88 [16];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_158.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8 = top_blobs;
  local_e0 = opt;
  if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    local_188 = 0;
    local_d8 = bottom_blobs;
    do {
      pvVar9 = local_d8;
      local_1a8.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1a8.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1a8.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::resize(&local_1a8,
               (long)*(int *)(&this->field_0xd4 + (long)this->_vptr_Yolov3DetectionOutput_x86[-3]));
      pMVar21 = (pvVar9->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pp_Var14 = this->_vptr_Yolov3DetectionOutput_x86;
      p_Var18 = pp_Var14[-3];
      iVar11 = *(int *)(&this->field_0xd4 + (long)p_Var18);
      iVar10 = pMVar21[local_188].c / iVar11;
      if (iVar10 != *(int *)(&this->field_0xd0 + (long)p_Var18) + 5) {
        std::
        vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
        ::~vector(&local_1a8);
        iVar11 = -1;
        goto LAB_0043b935;
      }
      if (0 < iVar11) {
        pMVar21 = pMVar21 + local_188;
        uVar24._0_4_ = pMVar21->w;
        uVar24._4_4_ = pMVar21->h;
        p_Var19 = (_func_int *)((long)&this->_vptr_Yolov3DetectionOutput_x86 + (long)p_Var18);
        local_68._0_4_ = (float)(int)(undefined4)uVar24;
        local_68._4_4_ = (undefined4)(int)uVar24._4_4_;
        fVar25 = *(float *)(*(long *)(p_Var19 + 0x170) + local_188 * 4);
        local_128 = (ulong)(uint)uVar24._4_4_;
        uVar24 = uVar24 & 0xffffffff;
        local_88._0_4_ = (undefined4)(int)(fVar25 * local_68._0_4_);
        local_88._4_4_ = (undefined4)(int)(fVar25 * (float)local_68._4_4_);
        local_88._8_4_ = (float)(int)(fVar25 * 0.0);
        local_88._12_4_ = (float)(int)(fVar25 * 0.0);
        local_c0 = (long)iVar10;
        register0x000012c8 = 0x3f0000003f000000;
        auVar26 = rcpps(local_88,_local_68);
        local_78 = auVar26._0_4_;
        fStack_74 = auVar26._4_4_;
        fStack_70 = auVar26._8_4_;
        fStack_6c = auVar26._12_4_;
        local_78 = (1.0 - local_68._0_4_ * local_78) * local_78 + local_78;
        fStack_74 = (1.0 - (float)local_68._4_4_ * fStack_74) * fStack_74 + fStack_74;
        fStack_70 = (1.0 - fStack_70 * 0.5) * fStack_70 + fStack_70;
        fStack_6c = (1.0 - fStack_6c * 0.5) * fStack_6c + fStack_6c;
        lVar20 = (long)iVar11 * local_188 * 4;
        local_180 = 0;
        local_d0 = pMVar21;
        local_c8 = lVar20;
        local_a0 = uVar24;
        do {
          uVar23 = pMVar21->elemsize;
          if (0 < (int)local_128) {
            lVar16 = local_180 * local_c0;
            sVar3 = pMVar21->cstep;
            pvVar4 = pMVar21->data;
            local_b8 = (void *)((lVar16 + 5) * sVar3 * uVar23 + (long)pvVar4);
            register0x00001248 =
                 *(undefined8 *)
                  (*(long *)(p_Var19 + 0xe0) +
                  (long)((int)*(float *)(*(long *)(p_Var19 + 0x128) + lVar20 + local_180 * 4) * 2) *
                  4);
            local_58 = 0x3f8000003f800000;
            pfVar22 = (float *)((lVar16 + 4) * sVar3 * uVar23 + (long)pvVar4);
            local_110 = (float *)((lVar16 + 3) * sVar3 * uVar23 + (long)pvVar4);
            local_118 = (float *)((lVar16 + 2) * sVar3 * uVar23 + (long)pvVar4);
            local_120 = (float *)((lVar16 + 1) * sVar3 * uVar23 + (long)pvVar4);
            pfVar17 = (float *)(lVar16 * sVar3 * uVar23 + (long)pvVar4);
            iVar11 = (int)(((long)pMVar21->d * uVar23 * (long)pMVar21->h * (long)pMVar21->w + 0xf &
                           0xfffffffffffffff0) / uVar23);
            local_98 = (long)iVar11;
            uVar23 = 0;
            do {
              local_b0 = uVar23;
              if (0 < (int)uVar24) {
                local_48 = (float)(int)uVar23;
                local_a8 = (void *)((long)local_b8 + uVar23 * uVar24 * 4);
                fStack_40 = (float)local_88._0_4_;
                fStack_3c = (float)local_88._4_4_;
                uVar23 = 0;
                fStack_44 = local_48;
                do {
                  p_Var18 = this->_vptr_Yolov3DetectionOutput_x86[-3];
                  lVar20 = *(int *)(&this->field_0xd0 + (long)p_Var18) * local_98;
                  if ((int)lVar20 < 1) {
                    iVar10 = 0;
                    local_f8 = -3.4028235e+38;
                  }
                  else {
                    pfVar12 = (float *)((long)local_a8 + uVar23 * 4);
                    pfVar1 = pfVar12 + lVar20;
                    iVar10 = 0;
                    local_f8 = -3.4028235e+38;
                    iVar15 = 0;
                    do {
                      fVar25 = *pfVar12;
                      if (local_f8 < fVar25) {
                        iVar10 = iVar15;
                      }
                      if (local_f8 <= fVar25) {
                        local_f8 = fVar25;
                      }
                      pfVar12 = pfVar12 + iVar11;
                      iVar15 = iVar15 + 1;
                    } while (pfVar12 < pfVar1);
                  }
                  uStack_f4 = 0;
                  uStack_f0 = 0;
                  uStack_ec = 0;
                  local_90 = pfVar17;
                  local_138 = expf(-*pfVar22);
                  fVar25 = expf(-local_f8);
                  pfVar17 = local_90;
                  fVar25 = 1.0 / ((fVar25 + 1.0) * local_138 + 1.0);
                  if (*(float *)(&this->field_0xd8 + (long)p_Var18) <= fVar25) {
                    auVar33 = ZEXT416((uint)*local_120);
                    local_108 = -*local_90;
                    fStack_104 = -*local_120;
                    uStack_100 = 0x80000000;
                    uStack_fc = 0x80000000;
                    local_f8 = fVar25;
                    local_138 = expf(local_108);
                    fStack_134 = extraout_XMM0_Db;
                    fVar25 = expf(fStack_104);
                    local_138 = local_138 + 1.0;
                    fStack_130 = fStack_134 + 0.0;
                    fStack_12c = extraout_XMM0_Db_00 + 0.0;
                    fStack_134 = fVar25 + 1.0;
                    local_108 = expf(*local_118);
                    fVar25 = expf(*local_110);
                    local_178.score = local_f8;
                    auVar26._4_4_ = fStack_134;
                    auVar26._0_4_ = local_138;
                    auVar26._8_4_ = fStack_130;
                    auVar26._12_4_ = fStack_12c;
                    auVar26 = rcpps(auVar33,auVar26);
                    auVar32._0_4_ = (float)local_58._0_4_ * auVar26._0_4_;
                    auVar32._4_4_ = (float)local_58._4_4_ * auVar26._4_4_;
                    auVar32._8_4_ = fStack_50 * auVar26._8_4_;
                    auVar32._12_4_ = fStack_4c * auVar26._12_4_;
                    fVar27 = ((float)local_58._4_4_ - fStack_134 * auVar32._4_4_) * auVar26._4_4_ +
                             auVar32._4_4_;
                    auVar5._4_8_ = auVar26._8_8_;
                    auVar5._0_4_ = fStack_44;
                    auVar33._0_8_ = auVar5._0_8_ << 0x20;
                    auVar33._8_4_ = fStack_40;
                    auVar33._12_4_ = fStack_3c;
                    auVar29._4_12_ = auVar33._4_12_;
                    auVar29._0_4_ = (float)(int)uVar23;
                    auVar33 = rcpps(auVar32,auVar29);
                    fVar36 = fVar27 * auVar33._4_4_;
                    local_178.area = local_108 * fStack_50 * auVar33._8_4_;
                    fVar37 = fVar25 * fStack_4c * auVar33._12_4_;
                    local_178.area =
                         (local_108 * fStack_50 - fStack_40 * local_178.area) * auVar33._8_4_ +
                         local_178.area;
                    fVar37 = (fVar25 * fStack_4c - fStack_3c * fVar37) * auVar33._12_4_ + fVar37;
                    fVar25 = (((float)local_58._0_4_ - local_138 * auVar32._0_4_) * auVar26._0_4_ +
                              auVar32._0_4_ + auVar29._0_4_) * local_78;
                    fVar28 = (fVar27 + fStack_44) * fStack_74;
                    fVar30 = local_178.area * fStack_60;
                    fVar31 = fVar37 * fStack_5c;
                    auVar34._4_4_ = fVar31;
                    auVar34._0_4_ = fVar30;
                    auVar34._8_4_ = fVar25;
                    auVar34._12_4_ = fVar28;
                    local_178.xmin = fVar25 - fVar30;
                    local_178.ymin = fVar28 - fVar31;
                    auVar6._4_8_ = auVar34._8_8_;
                    auVar6._0_4_ = fVar31 + ((fVar27 - fStack_44 * fVar36) * auVar33._4_4_ + fVar36)
                                            * (float)local_68._4_4_;
                    auVar35._0_8_ = auVar6._0_8_ << 0x20;
                    auVar35._8_4_ = fVar25 + fVar30;
                    auVar35._12_4_ = fVar28 + fVar31;
                    local_178.area = local_178.area * fVar37;
                    this_00 = (vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                               *)(local_1a8.
                                  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + local_180);
                    __position._M_current = *(BBoxRect **)(this_00 + 8);
                    local_178.xmax = auVar35._8_4_;
                    local_178.ymax = auVar35._12_4_;
                    local_178.label = iVar10;
                    if (__position._M_current == *(BBoxRect **)(this_00 + 0x10)) {
                      std::
                      vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                      ::_M_realloc_insert<ncnn::Yolov3DetectionOutput::BBoxRect_const&>
                                (this_00,__position,&local_178);
                    }
                    else {
                      (__position._M_current)->xmax = (float)(int)auVar35._8_8_;
                      (__position._M_current)->ymax = (float)(int)((ulong)auVar35._8_8_ >> 0x20);
                      (__position._M_current)->area = local_178.area;
                      (__position._M_current)->label = iVar10;
                      (__position._M_current)->score = local_f8;
                      (__position._M_current)->xmin = local_178.xmin;
                      (__position._M_current)->ymin = local_178.ymin;
                      (__position._M_current)->xmax = auVar35._8_4_;
                      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x1c;
                    }
                  }
                  pfVar17 = pfVar17 + 1;
                  local_120 = local_120 + 1;
                  local_118 = local_118 + 1;
                  local_110 = local_110 + 1;
                  pfVar22 = pfVar22 + 1;
                  uVar23 = uVar23 + 1;
                  uVar24 = local_a0;
                } while (uVar23 != local_a0);
              }
              uVar23 = local_b0 + 1;
            } while (uVar23 != local_128);
            pp_Var14 = this->_vptr_Yolov3DetectionOutput_x86;
            lVar20 = local_c8;
            pMVar21 = local_d0;
          }
          local_180 = local_180 + 1;
          p_Var18 = pp_Var14[-3];
          p_Var19 = (_func_int *)((long)&this->_vptr_Yolov3DetectionOutput_x86 + (long)p_Var18);
        } while (local_180 < *(int *)(&this->field_0xd4 + (long)p_Var18));
      }
      if (0 < *(int *)(&this->field_0xd4 + (long)p_Var18)) {
        lVar20 = 8;
        lVar16 = 0;
        do {
          std::
          vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
          ::
          _M_range_insert<__gnu_cxx::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>>
                    ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                      *)&local_158,
                     local_158.
                     super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     *(undefined8 *)
                      ((long)local_1a8.
                             super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar20 + -8),
                     *(undefined8 *)
                      ((long)&((local_1a8.
                                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                              )._M_impl.super__Vector_impl_data._M_start + lVar20));
          lVar16 = lVar16 + 1;
          lVar20 = lVar20 + 0x18;
        } while (lVar16 < *(int *)(&this->field_0xd4 +
                                  (long)this->_vptr_Yolov3DetectionOutput_x86[-3]));
      }
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::~vector(&local_1a8);
      local_188 = local_188 + 1;
    } while (local_188 <
             (ulong)(((long)(local_d8->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_d8->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                            _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7));
  }
  Yolov3DetectionOutput::qsort_descent_inplace
            ((Yolov3DetectionOutput *)
             ((long)&this->_vptr_Yolov3DetectionOutput_x86 +
             (long)this->_vptr_Yolov3DetectionOutput_x86[-3]),&local_158);
  local_178.score = 0.0;
  local_178.xmin = 0.0;
  local_178.ymin = 0.0;
  local_178.xmax = 0.0;
  local_178.ymax = 0.0;
  local_178.area = 0.0;
  Yolov3DetectionOutput::nms_sorted_bboxes
            ((Yolov3DetectionOutput *)
             ((long)&this->_vptr_Yolov3DetectionOutput_x86 +
             (long)this->_vptr_Yolov3DetectionOutput_x86[-3]),&local_158,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_178,
             *(float *)(&this->field_0xdc + (long)this->_vptr_Yolov3DetectionOutput_x86[-3]));
  local_1a8.
  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.
  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.
  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar20 = CONCAT44(local_178.xmin,local_178.score);
  lVar16 = CONCAT44(local_178.xmax,local_178.ymin);
  if (lVar16 == lVar20) {
    iVar11 = 0;
  }
  else {
    uVar24 = 0;
    do {
      __args = local_158.
               super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
               ._M_impl.super__Vector_impl_data._M_start + *(long *)(lVar20 + uVar24 * 8);
      if (local_1a8.
          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_1a8.
          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
        ::_M_realloc_insert<ncnn::Yolov3DetectionOutput::BBoxRect_const&>
                  ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                    *)&local_1a8,
                   (iterator)
                   local_1a8.
                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,__args);
        lVar20 = CONCAT44(local_178.xmin,local_178.score);
        lVar16 = CONCAT44(local_178.xmax,local_178.ymin);
      }
      else {
        uVar7 = *(undefined8 *)__args;
        uVar8 = *(undefined8 *)&__args->ymin;
        *(undefined1 (*) [16])
         ((long)local_1a8.
                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + 0xc) =
             *(undefined1 (*) [16])&__args->xmax;
        *(undefined8 *)
         local_1a8.
         super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish = uVar7;
        *(undefined8 *)
         ((long)local_1a8.
                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + 8) = uVar8;
        local_1a8.
        super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)((long)local_1a8.
                             super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 0x1c);
      }
      uVar24 = uVar24 + 1;
    } while (uVar24 < (ulong)(lVar16 - lVar20 >> 3));
    _h = (int)((long)local_1a8.
                     super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_1a8.
                     super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x49249249;
    iVar11 = 0;
    if (_h != 0) {
      this_01 = (local_e8->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      Mat::create(this_01,6,_h,4,local_e0->blob_allocator);
      iVar11 = -100;
      if (((this_01->data != (void *)0x0) && ((long)this_01->c * this_01->cstep != 0)) &&
         (iVar11 = 0, 0 < (int)_h)) {
        iVar10 = this_01->w;
        sVar3 = this_01->elemsize;
        puVar13 = (undefined4 *)((long)this_01->data + 0x14);
        iVar11 = 0;
        lVar20 = 0;
        do {
          uVar2 = *(undefined4 *)
                   ((long)&((local_1a8.
                             super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                           )._M_impl.super__Vector_impl_data._M_start + lVar20);
          puVar13[-5] = (float)*(int *)((long)&local_1a8.
                                               super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[1].
                                               super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                               ._M_impl.super__Vector_impl_data._M_start + lVar20) +
                        1.0;
          puVar13[-4] = uVar2;
          puVar13[-3] = *(undefined4 *)
                         ((long)&((local_1a8.
                                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                 )._M_impl.super__Vector_impl_data._M_start + lVar20 + 4);
          puVar13[-2] = *(undefined4 *)
                         ((long)&((local_1a8.
                                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                 )._M_impl.super__Vector_impl_data._M_finish + lVar20);
          puVar13[-1] = *(undefined4 *)
                         ((long)&((local_1a8.
                                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                 )._M_impl.super__Vector_impl_data._M_finish + lVar20 + 4);
          *puVar13 = *(undefined4 *)
                      ((long)&((local_1a8.
                                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                              )._M_impl.super__Vector_impl_data._M_end_of_storage + lVar20);
          lVar20 = lVar20 + 0x1c;
          puVar13 = (undefined4 *)((long)puVar13 + (long)iVar10 * sVar3);
        } while ((ulong)(_h & 0x7fffffff) * 0x1c != lVar20);
      }
    }
  }
  if (local_1a8.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.
                    super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1a8.
                          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a8.
                          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pvVar4 = (void *)CONCAT44(local_178.xmin,local_178.score);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,CONCAT44(local_178.area,local_178.ymax) - (long)pvVar4);
  }
LAB_0043b935:
  if (local_158.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.
                    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.
                          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.
                          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return iVar11;
}

Assistant:

int Yolov3DetectionOutput_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        all_box_bbox_rects.resize(num_box);
        const Mat& bottom_top_blobs = bottom_blobs[b];

        int w = bottom_top_blobs.w;
        int h = bottom_top_blobs.h;
        int channels = bottom_top_blobs.c;
        //printf("%d %d %d\n", w, h, channels);
        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;
        size_t mask_offset = b * num_box;
        int net_w = (int)(anchors_scale[b] * w);
        int net_h = (int)(anchors_scale[b] * h);
//printf("%d %d\n", net_w, net_h);

//printf("%d %d %d\n", w, h, channels);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;
            int biases_index = static_cast<int>(mask[pp + mask_offset]);
            //printf("%d\n", biases_index);
            const float bias_w = biases[biases_index * 2];
            const float bias_h = biases[biases_index * 2 + 1];
            //printf("%f %f\n", bias_w, bias_h);
            const float* xptr = bottom_top_blobs.channel(p);
            const float* yptr = bottom_top_blobs.channel(p + 1);
            const float* wptr = bottom_top_blobs.channel(p + 2);
            const float* hptr = bottom_top_blobs.channel(p + 3);

            const float* box_score_ptr = bottom_top_blobs.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blobs.channel_range(p + 5, num_class);
            //softmax->forward_inplace(scores, opt);

            const int cs = (int)scores.cstep;

#if __AVX2__
            const __m256i vi = _mm256_setr_epi32(
                                   0, cs * 1, cs * 2, cs * 3, cs * 4, cs * 5, cs * 6, cs * 7);
#endif

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
#if 0
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }
#else
                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    float* ptr = ((float*)scores.data) + i * w + j;
                    float* end = ptr + num_class * cs;
                    int q = 0;
#if __AVX2__
                    float* end8 = ptr + (num_class & -8) * cs;
                    unsigned long index;

                    for (; ptr < end8; ptr += 8 * cs, q += 8)
                    {
                        __m256 p = _mm256_i32gather_ps(ptr, vi, 4);
                        __m256 t = _mm256_max_ps(p, _mm256_permute2f128_ps(p, p, 1));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0x4e));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0xb1));
                        float score = _mm_cvtss_f32(_mm256_extractf128_ps(t, 0));

                        if (score > class_score)
                        {
                            __m256 mi = _mm256_cmp_ps(p, t, _CMP_EQ_OQ);
                            int mask = _mm256_movemask_ps(mi);
#ifdef _MSC_VER
                            BitScanForward(&index, mask);
#else
                            index = __builtin_ctz(mask);
#endif
                            class_index = q + index;
                            class_score = score;
                        }
                    }
#endif

                    for (; ptr < end; ptr += cs, q++)
                    {
                        if (*ptr > class_score)
                        {
                            class_index = q;
                            class_score = *ptr;
                        }
                    }
#endif
                    //sigmoid(box_score) * sigmoid(class_score)
                    float confidence = 1.f / ((1.f + expf(-box_score_ptr[0]) * (1.f + expf(-class_score))));
                    if (confidence >= confidence_threshold)
                    {
                        // region box
                        float bbox_cx = (j + sigmoid(xptr[0])) / w;
                        float bbox_cy = (i + sigmoid(yptr[0])) / h;
                        float bbox_w = expf(wptr[0]) * bias_w / net_w;
                        float bbox_h = expf(hptr[0]) * bias_h / net_h;

                        float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                        float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                        float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                        float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                        float area = bbox_w * bbox_h;

                        BBoxRect c = {confidence, bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, area, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = r.score;
        float* outptr = top_blob.row(i);

        outptr[0] = r.label + 1.0f; // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}